

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O3

char * duckdb::NumericHelper::FormatUnsigned<duckdb::hugeint_t>(hugeint_t value,char *ptr)

{
  unsigned_long in_RAX;
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  uint64_t *in_R8;
  hugeint_t lhs;
  uint64_t remainder;
  unsigned_long local_38;
  
  local_38 = in_RAX;
  while( true ) {
    if (value.upper < 1) break;
    lhs.upper = 100000000000000000;
    lhs.lower = value.upper;
    value = Hugeint::DivModPositive((Hugeint *)value.lower,lhs,(uint64_t)&local_38,in_R8);
    pcVar1 = FormatUnsigned<unsigned_long>(local_38,ptr);
    iVar3 = (int)ptr;
    ptr = pcVar1;
    if (iVar3 - (int)pcVar1 < 0x11) {
      uVar2 = (ulong)(((int)pcVar1 - iVar3) + 0x10);
      ptr = pcVar1 + ~uVar2;
      switchD_012e3010::default(ptr,0x30,uVar2 + 1);
    }
  }
  pcVar1 = FormatUnsigned<unsigned_long>((unsigned_long)value.lower,ptr);
  return pcVar1;
}

Assistant:

char *NumericHelper::FormatUnsigned(hugeint_t value, char *ptr) {
	while (value.upper > 0) {
		// while integer division is slow, hugeint division is MEGA slow
		// we want to avoid doing as many divisions as possible
		// for that reason we start off doing a division by a large power of ten that uint64_t can hold
		// (100000000000000000) - this is the third largest
		// the reason we don't use the largest is because that can result in an overflow inside the division
		// function
		uint64_t remainder;
		value = Hugeint::DivModPositive(value, 100000000000000000ULL, remainder);

		auto startptr = ptr;
		// now we format the remainder: note that we need to pad with zero's in case
		// the remainder is small (i.e. less than 10000000000000000)
		ptr = NumericHelper::FormatUnsigned<uint64_t>(remainder, ptr);

		int format_length = UnsafeNumericCast<int>(startptr - ptr);
		// pad with zero
		for (int i = format_length; i < 17; i++) {
			*--ptr = '0';
		}
	}
	// once the value falls in the range of a uint64_t, fallback to formatting as uint64_t to avoid hugeint division
	return NumericHelper::FormatUnsigned<uint64_t>(value.lower, ptr);
}